

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_server.h
# Opt level: O0

void __thiscall
blcl::net::server_interface<MsgType>::update
          (server_interface<MsgType> *this,size_t max_message_count,bool wait)

{
  bool bVar1;
  byte local_81;
  shared_ptr<blcl::net::connection<MsgType>_> local_68;
  undefined1 local_58 [8];
  owned_message<MsgType> msg;
  size_t message_count;
  bool wait_local;
  size_t max_message_count_local;
  server_interface<MsgType> *this_local;
  
  if (wait) {
    tsqueue<blcl::net::owned_message<MsgType>_>::wait
              (&this->incoming_messages_,(void *)max_message_count);
  }
  msg.msg.body.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    local_81 = 0;
    if (msg.msg.body.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage < max_message_count) {
      bVar1 = tsqueue<blcl::net::owned_message<MsgType>_>::empty(&this->incoming_messages_);
      local_81 = bVar1 ^ 0xff;
    }
    if ((local_81 & 1) == 0) break;
    tsqueue<blcl::net::owned_message<MsgType>_>::pop_front
              ((owned_message<MsgType> *)local_58,&this->incoming_messages_);
    std::shared_ptr<blcl::net::connection<MsgType>_>::shared_ptr
              (&local_68,(shared_ptr<blcl::net::connection<MsgType>_> *)local_58);
    (*this->_vptr_server_interface[4])
              (this,&local_68,
               &msg.remote.
                super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::shared_ptr<blcl::net::connection<MsgType>_>::~shared_ptr(&local_68);
    msg.msg.body.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         msg.msg.body.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage + 1;
    owned_message<MsgType>::~owned_message((owned_message<MsgType> *)local_58);
  }
  return;
}

Assistant:

void update(size_t max_message_count = -1, bool wait = true) {
            if (wait)
                incoming_messages_.wait();

            size_t message_count = 0;
            while (message_count < max_message_count && !incoming_messages_.empty()) {
                auto msg = incoming_messages_.pop_front();
                on_message(msg.remote, msg.msg);
                message_count++;
            }
        }